

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

ModulePtr chaiscript::bootstrap::opers_comparison<std::__cxx11::string>(ModulePtr *m)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ModulePtr MVar1;
  shared_ptr<chaiscript::Module> *in_stack_fffffffffffffed8;
  shared_ptr<chaiscript::Module> *__r;
  shared_ptr<chaiscript::Module> *in_stack_fffffffffffffee0;
  shared_ptr<chaiscript::Module> *this;
  shared_ptr<chaiscript::Module> local_e0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff48;
  
  std::shared_ptr<chaiscript::Module>::shared_ptr
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  operators::equal<std::__cxx11::string>((ModulePtr *)in_stack_ffffffffffffff48._M_pi);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x3f1a9c);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x3f1aa9);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  operators::greater_than<std::__cxx11::string>((ModulePtr *)in_stack_ffffffffffffff48._M_pi);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x3f1ae1);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x3f1aee);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  operators::greater_than_equal<std::__cxx11::string>((ModulePtr *)in_stack_ffffffffffffff48._M_pi);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x3f1b26);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x3f1b33);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  operators::less_than<std::__cxx11::string>((ModulePtr *)in_stack_ffffffffffffff48._M_pi);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x3f1b6b);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x3f1b78);
  this = (shared_ptr<chaiscript::Module> *)&stack0xffffffffffffff40;
  std::shared_ptr<chaiscript::Module>::shared_ptr(this,in_stack_fffffffffffffed8);
  operators::less_than_equal<std::__cxx11::string>((ModulePtr *)in_stack_ffffffffffffff48._M_pi);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x3f1ba7);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x3f1bb1);
  __r = local_e0;
  std::shared_ptr<chaiscript::Module>::shared_ptr(this,__r);
  operators::not_equal<std::__cxx11::string>((ModulePtr *)in_stack_ffffffffffffff48._M_pi);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x3f1bde);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x3f1be8);
  std::shared_ptr<chaiscript::Module>::shared_ptr(this,__r);
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ModulePtr)MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr opers_comparison(ModulePtr m = std::make_shared<Module>())
    {
      operators::equal<T>(m);
      operators::greater_than<T>(m);
      operators::greater_than_equal<T>(m);
      operators::less_than<T>(m);
      operators::less_than_equal<T>(m);
      operators::not_equal<T>(m);
      return m;
    }